

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyFileImpl::fileOpenFinished(QNetworkReplyFileImpl *this,bool isOpen)

{
  qint64 _t1;
  byte in_SIL;
  QNetworkReply *in_RDI;
  qint64 fileSize;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  
  QNetworkReply::setFinished(in_RDI,(bool)in_stack_ffffffffffffffdf);
  if ((in_SIL & 1) != 0) {
    _t1 = (**(code **)(*(long *)in_RDI + 0x80))();
    QNetworkReply::metaDataChanged((QNetworkReply *)0x1e74ee);
    QNetworkReply::downloadProgress
              ((QNetworkReply *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),_t1,
               (qint64)in_RDI);
    QIODevice::readyRead();
  }
  QNetworkReply::finished((QNetworkReply *)0x1e7516);
  return;
}

Assistant:

void QNetworkReplyFileImpl::fileOpenFinished(bool isOpen)
{
    setFinished(true);
    if (isOpen) {
        const auto fileSize = size();
        Q_EMIT metaDataChanged();
        Q_EMIT downloadProgress(fileSize, fileSize);
        Q_EMIT readyRead();
    }
    Q_EMIT finished();
}